

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDetect.c
# Opt level: O2

void Mio_LibGateSimulate(Mio_Gate_t *pGate,word **ppFaninSims,int nWords,word *pObjSim)

{
  uint nVars;
  int iVar1;
  Vec_Int_t *p;
  ulong uVar2;
  word *puNodes;
  word wVar3;
  word wVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  int i;
  ulong uVar8;
  word uFanins [6];
  
  nVars = Mio_GateReadPinNum(pGate);
  p = Mio_GateReadExpr(pGate);
  if (6 < (int)nVars) {
    __assert_fail("nVars <= 6",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcDetect.c"
                  ,0x216,"void Mio_LibGateSimulate(Mio_Gate_t *, word **, int, word *)");
  }
  uVar5 = 0;
  uVar6 = (ulong)nVars;
  if ((int)nVars < 1) {
    uVar6 = uVar5;
  }
  uVar8 = (ulong)(uint)nWords;
  if (nWords < 1) {
    uVar8 = uVar5;
  }
  for (; uVar5 != uVar8; uVar5 = uVar5 + 1) {
    for (uVar2 = 0; uVar6 != uVar2; uVar2 = uVar2 + 1) {
      uFanins[uVar2] = ppFaninSims[uVar2][uVar5];
    }
    iVar1 = p->nSize;
    puNodes = (word *)calloc((long)(iVar1 / 2),8);
    i = 0;
    for (lVar7 = 0; lVar7 < iVar1 / 2; lVar7 = lVar7 + 1) {
      iVar1 = Vec_IntEntry(p,i);
      wVar3 = Exp_Truth6Lit(nVars,iVar1,uFanins,puNodes);
      iVar1 = Vec_IntEntry(p,i + 1);
      wVar4 = Exp_Truth6Lit(nVars,iVar1,uFanins,puNodes);
      puNodes[lVar7] = wVar4 & wVar3;
      iVar1 = p->nSize;
      i = i + 2;
    }
    iVar1 = Vec_IntEntryLast(p);
    wVar3 = Exp_Truth6Lit(nVars,iVar1,uFanins,puNodes);
    free(puNodes);
    pObjSim[uVar5] = wVar3;
  }
  return;
}

Assistant:

void Mio_LibGateSimulate( Mio_Gate_t * pGate, word * ppFaninSims[6], int nWords, word * pObjSim )
{
    int i, w, nVars = Mio_GateReadPinNum(pGate);
    Vec_Int_t * vExpr = Mio_GateReadExpr( pGate );
    assert( nVars <= 6 );
    for ( w = 0; w < nWords; w++ )
    {
        word uFanins[6];
        for ( i = 0; i < nVars; i++ )
            uFanins[i] = ppFaninSims[i][w];
        pObjSim[w] = Exp_Truth6( nVars, vExpr, uFanins );
    }
}